

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O0

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  int mods_local;
  int action_local;
  int scancode_local;
  int key_local;
  GLFWwindow *window_local;
  
  if (action == 1) {
    if (key == 0x20) {
      init_grid();
    }
    else if (key == 0x100) {
      glfwSetWindowShouldClose(window,1);
    }
    else if (key == 0x106) {
      alpha = alpha - 5.0;
    }
    else if (key == 0x107) {
      alpha = alpha + 5.0;
    }
    else if (key == 0x108) {
      beta = beta + 5.0;
    }
    else if (key == 0x109) {
      beta = beta - 5.0;
    }
    else if (key == 0x10a) {
      zoom = zoom - 0.25;
      if (zoom < 0.0) {
        zoom = 0.0;
      }
    }
    else if (key == 0x10b) {
      zoom = zoom + 0.25;
    }
  }
  return;
}

Assistant:

void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, GLFW_TRUE);
            break;
        case GLFW_KEY_SPACE:
            init_grid();
            break;
        case GLFW_KEY_LEFT:
            alpha += 5;
            break;
        case GLFW_KEY_RIGHT:
            alpha -= 5;
            break;
        case GLFW_KEY_UP:
            beta -= 5;
            break;
        case GLFW_KEY_DOWN:
            beta += 5;
            break;
        case GLFW_KEY_PAGE_UP:
            zoom -= 0.25f;
            if (zoom < 0.f)
                zoom = 0.f;
            break;
        case GLFW_KEY_PAGE_DOWN:
            zoom += 0.25f;
            break;
        default:
            break;
    }
}